

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-problem-builder.h
# Opt level: O3

void __thiscall MockProblemBuilder::MockProblemBuilder(MockProblemBuilder *this)

{
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock1_suffixes_146).
  super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)> *)this;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_suffixes_146).
          super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_suffixes_146).
          super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_suffixes_146).
               super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_suffixes_146).
  super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.current_spec_.matchers_
  .super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_suffixes_146).
  super_FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028a428;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_num_vars_148);
  (this->gmock0_num_vars_148).super_FunctionMockerBase<int_()>.current_spec_.function_mocker_ =
       &(this->gmock0_num_vars_148).super_FunctionMockerBase<int_()>;
  (this->gmock0_num_vars_148).super_FunctionMockerBase<int_()>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0028a5d0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_num_algebraic_cons_149);
  (this->gmock0_num_algebraic_cons_149).super_FunctionMockerBase<int_()>.current_spec_.
  function_mocker_ = &(this->gmock0_num_algebraic_cons_149).super_FunctionMockerBase<int_()>;
  (this->gmock0_num_algebraic_cons_149).super_FunctionMockerBase<int_()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028a5d0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_num_logical_cons_150);
  (this->gmock0_num_logical_cons_150).super_FunctionMockerBase<int_()>.current_spec_.
  function_mocker_ = &(this->gmock0_num_logical_cons_150).super_FunctionMockerBase<int_()>;
  (this->gmock0_num_logical_cons_150).super_FunctionMockerBase<int_()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028a5d0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_SetInfo_152);
  (this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>;
  ((linked_ptr<const_testing::MatcherInterface<const_mp::NLProblemInfo_&>_> *)
  ((long)&(this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>_>.
          super__Head_base<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>,_false>._M_head_impl + 8
  ))->value_ = (MatcherInterface<const_mp::NLProblemInfo_&> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>_>.
          super__Head_base<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>,_false>._M_head_impl +
  0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>_>.
               super__Head_base<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>,_false>.
               _M_head_impl + 0x10);
  (this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>_>.
  super__Head_base<0UL,_testing::Matcher<const_mp::NLProblemInfo_&>,_false>._M_head_impl.
  super_MatcherBase<const_mp::NLProblemInfo_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028a7a0;
  (this->gmock1_SetInfo_152).super_FunctionMockerBase<void_(const_mp::NLProblemInfo_&)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028a6d0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_EndBuild_153);
  (this->gmock0_EndBuild_153).super_FunctionMockerBase<void_()>.current_spec_.function_mocker_ =
       &(this->gmock0_EndBuild_153).super_FunctionMockerBase<void_()>;
  (this->gmock0_EndBuild_153).super_FunctionMockerBase<void_()>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0028a838;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_AddVar_155);
  (this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>;
  ((linked_ptr<const_testing::MatcherInterface<mp::var::Type>_> *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::var::Type>_> + 8))->value_ =
       (MatcherInterface<mp::var::Type> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::var::Type>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddVar_155).
               super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.current_spec_.
               matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
               .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
               super__Tuple_impl<2UL,_testing::Matcher<mp::var::Type>_> + 0x10);
  (this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
  .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
  super__Tuple_impl<2UL,_testing::Matcher<mp::var::Type>_>.
  super__Head_base<2UL,_testing::Matcher<mp::var::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::var::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a9d8;
  ((linked_ptr<const_testing::MatcherInterface<double>_> *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<1UL,_testing::Matcher<double>,_false> + 8))->value_ =
       (MatcherInterface<double> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<1UL,_testing::Matcher<double>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddVar_155).
               super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.current_spec_.
               matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
               .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
               super__Head_base<1UL,_testing::Matcher<double>,_false> + 0x10);
  (this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
  .super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aa40;
  ((linked_ptr<const_testing::MatcherInterface<double>_> *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<double> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
          .super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddVar_155).
               super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.current_spec_.
               matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
               .super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10);
  (this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
  .super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aa40;
  (this->gmock3_AddVar_155).super_FunctionMockerBase<void_(double,_double,_mp::var::Type)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028a908;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_AddVars_156);
  (this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.current_spec_.
  function_mocker_ = &(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<mp::var::Type>_> *)
  ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
          super__Tuple_impl<1UL,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<1UL,_testing::Matcher<mp::var::Type>,_false> + 8))->value_ =
       (MatcherInterface<mp::var::Type> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
          super__Tuple_impl<1UL,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<1UL,_testing::Matcher<mp::var::Type>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
               super__Tuple_impl<1UL,_testing::Matcher<mp::var::Type>_>.
               super__Head_base<1UL,_testing::Matcher<mp::var::Type>,_false> + 0x10);
  (this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
  super__Tuple_impl<1UL,_testing::Matcher<mp::var::Type>_>.
  super__Head_base<1UL,_testing::Matcher<mp::var::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::var::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a9d8;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock2_AddVars_156).super_FunctionMockerBase<void_(int,_mp::var::Type)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028aad8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddObj_160);
  (this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>;
  ((linked_ptr<const_testing::MatcherInterface<mp::obj::Type>_> *)
  ((long)&(this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
          super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<mp::obj::Type> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
          super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl + 0x10))->next_
       = (linked_ptr_internal *)
         ((long)&(this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.
                 current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
                 super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
  super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::obj::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aca8;
  (this->gmock1_AddObj_160).super_FunctionMockerBase<void_(mp::obj::Type)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028abd8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddObjs_161);
  (this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.current_spec_.function_mocker_ =
       &(this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_AddObjs_161).super_FunctionMockerBase<void_(int)>.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0028ad40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_AddCon_165);
  (this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.
  function_mocker_ = &(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>;
  ((linked_ptr<const_testing::MatcherInterface<double>_> *)
  ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
          super__Tuple_impl<1UL,_testing::Matcher<double>_>.
          super__Head_base<1UL,_testing::Matcher<double>,_false> + 8))->value_ =
       (MatcherInterface<double> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
          super__Tuple_impl<1UL,_testing::Matcher<double>_>.
          super__Head_base<1UL,_testing::Matcher<double>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
               super__Tuple_impl<1UL,_testing::Matcher<double>_>.
               super__Head_base<1UL,_testing::Matcher<double>,_false> + 0x10);
  (this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aa40;
  ((linked_ptr<const_testing::MatcherInterface<double>_> *)
  ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
          super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<double> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
          super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
               super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10);
  (this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aa40;
  (this->gmock2_AddCon_165).super_FunctionMockerBase<void_(double,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ae10;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddCon_166);
  (this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.
                  current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
                  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl +
          0x10);
  (this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  (this->gmock1_AddCon_166).super_FunctionMockerBase<void_(BasicTestExpr<2>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028af10;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddAlgebraicCons_167);
  (this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_AddAlgebraicCons_167).super_FunctionMockerBase<void_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ad40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddLogicalCons_168);
  (this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_AddLogicalCons_168).super_FunctionMockerBase<void_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ad40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_common_expr_183);
  (this->gmock1_common_expr_183).super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_common_expr_183).
        super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_common_expr_183).
          super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.current_spec_.matchers_
          .super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_common_expr_183).
          super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.current_spec_.matchers_
          .super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_common_expr_183).
               super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_common_expr_183).super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_common_expr_183).super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b078;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddCommonExpr_185);
  (this->gmock1_AddCommonExpr_185).
  super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_AddCommonExpr_185).
        super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock1_AddCommonExpr_185).
          super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddCommonExpr_185).
          super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock1_AddCommonExpr_185).
                  super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.
                  current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<1>_>_>.
                  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl +
          0x10);
  (this->gmock1_AddCommonExpr_185).
  super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  (this->gmock1_AddCommonExpr_185).
  super_FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b188;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddCommonExprs_186);
  (this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_AddCommonExprs_186).super_FunctionMockerBase<void_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ad40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_SetComplementarity_189);
  (this->gmock3_SetComplementarity_189).super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_SetComplementarity_189).
        super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>;
  ((linked_ptr<const_testing::MatcherInterface<mp::ComplInfo>_> *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::ComplInfo>_> + 8))->value_ =
       (MatcherInterface<mp::ComplInfo> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::ComplInfo>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_SetComplementarity_189).
               super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
               super__Tuple_impl<2UL,_testing::Matcher<mp::ComplInfo>_> + 0x10);
  (this->gmock3_SetComplementarity_189).super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
  super__Tuple_impl<2UL,_testing::Matcher<mp::ComplInfo>_>.
  super__Head_base<2UL,_testing::Matcher<mp::ComplInfo>,_false>._M_head_impl.
  super_MatcherBase<mp::ComplInfo>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b3c0;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_SetComplementarity_189).
               super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock3_SetComplementarity_189).super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_SetComplementarity_189).
          super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
          .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_SetComplementarity_189).
               super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
               .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock3_SetComplementarity_189).super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
  .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock3_SetComplementarity_189).super_FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b2f0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_var_200);
  (this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_var_200).
               super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_var_200).super_FunctionMockerBase<MockProblemBuilder::MutVariable_&(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b458;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_obj_210);
  (this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>
               .current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_obj_210).super_FunctionMockerBase<MockProblemBuilder::Objective_&(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b568;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_algebraic_con_222);
  (this->gmock1_algebraic_con_222).super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>
  .current_spec_.function_mocker_ =
       &(this->gmock1_algebraic_con_222).
        super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_algebraic_con_222).
          super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_algebraic_con_222).
          super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_algebraic_con_222).
               super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_algebraic_con_222).super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>
  .current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_algebraic_con_222).super_FunctionMockerBase<MockProblemBuilder::AlgebraicCon_&(int)>
  .super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b678;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_logical_con_229);
  (this->gmock1_logical_con_229).super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_logical_con_229).
        super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_logical_con_229).
          super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_logical_con_229).
          super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_logical_con_229).
               super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_logical_con_229).super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_logical_con_229).super_FunctionMockerBase<MockProblemBuilder::LogicalCon_&(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b788;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_GetColumnSizeHandler_233);
  (this->gmock0_GetColumnSizeHandler_233).super_FunctionMockerBase<TestColumnSizeHandler_()>.
  current_spec_.function_mocker_ =
       &(this->gmock0_GetColumnSizeHandler_233).super_FunctionMockerBase<TestColumnSizeHandler_()>;
  (this->gmock0_GetColumnSizeHandler_233).super_FunctionMockerBase<TestColumnSizeHandler_()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b898;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_AddFunctions_235);
  (this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_AddFunctions_235).super_FunctionMockerBase<void_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ad40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_AddFunction_238);
  (this->gmock3_AddFunction_238).
  super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_AddFunction_238).
        super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>;
  ((linked_ptr<const_testing::MatcherInterface<mp::func::Type>_> *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::func::Type>_> + 8))->value_ =
       (MatcherInterface<mp::func::Type> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
          super__Tuple_impl<2UL,_testing::Matcher<mp::func::Type>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddFunction_238).
               super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
               super__Tuple_impl<2UL,_testing::Matcher<mp::func::Type>_> + 0x10);
  (this->gmock3_AddFunction_238).
  super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
  super__Tuple_impl<2UL,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<2UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::func::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028ba78;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddFunction_238).
               super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock3_AddFunction_238).
  super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  8))->value_ = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddFunction_238).
          super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddFunction_238).
               super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
               .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
               _M_head_impl + 0x10);
  (this->gmock3_AddFunction_238).
  super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  (this->gmock3_AddFunction_238).
  super_FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028b9a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock4_DefineFunction_241);
  (this->gmock4_DefineFunction_241).
  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.function_mocker_ =
       &(this->gmock4_DefineFunction_241).
        super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<mp::func::Type>_> *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_> + 8))->
  value_ = (MatcherInterface<mp::func::Type> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_> + 0x10))
  ->next_ = (linked_ptr_internal *)
            ((long)&(this->gmock4_DefineFunction_241).
                    super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                    .current_spec_.matchers_.
                    super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                    .
                    super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                    .
                    super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
            + 0x10);
  (this->gmock4_DefineFunction_241).
  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>.
  super__Tuple_impl<3UL,_testing::Matcher<mp::func::Type>_>.
  super__Head_base<3UL,_testing::Matcher<mp::func::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::func::Type>._vptr_MatcherBase = &PTR__MatcherBase_0028ba78;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_> + 0x20))
  ->value_ = (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_> + 0x28))
  ->next_ = (linked_ptr_internal *)
            ((long)&(this->gmock4_DefineFunction_241).
                    super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                    .current_spec_.matchers_.
                    super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                    .
                    super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                    .
                    super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
            + 0x28);
  (((_Head_base<2UL,_testing::Matcher<int>,_false> *)
   ((long)&(this->gmock4_DefineFunction_241).
           super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
           .current_spec_.matchers_.
           super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
           .
           super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
           .super__Tuple_impl<2UL,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_> + 0x18)
   )->_M_head_impl).super_MatcherBase<int>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 8))->value_
       = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock4_DefineFunction_241).
                  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                  .
                  super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
                  .super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false> + 0x10
          );
  (this->gmock4_DefineFunction_241).
  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Head_base<1UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock4_DefineFunction_241).
          super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
          .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock4_DefineFunction_241).
               super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
               .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock4_DefineFunction_241).
  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<mp::func::Type>_>
  .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock4_DefineFunction_241).
  super_FunctionMockerBase<TestFunction_(int,_fmt::BasicStringRef<char>,_int,_mp::func::Type)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028bbb8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_function_243);
  (this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_function_243).super_FunctionMockerBase<TestFunction_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028bcb8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_AddIntSuffix_249);
  (this->gmock3_AddIntSuffix_249).
  super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.current_spec_
  .function_mocker_ =
       &(this->gmock3_AddIntSuffix_249).
        super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
          super__Tuple_impl<2UL,_testing::Matcher<int>_> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
          super__Tuple_impl<2UL,_testing::Matcher<int>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddIntSuffix_249).
               super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
               super__Tuple_impl<2UL,_testing::Matcher<int>_> + 0x10);
  (this->gmock3_AddIntSuffix_249).
  super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.current_spec_
  .matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<int>_>.super__Head_base<2UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddIntSuffix_249).
               super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
               .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock3_AddIntSuffix_249).
  super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.current_spec_
  .matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  8))->value_ = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddIntSuffix_249).
          super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddIntSuffix_249).
               super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
               .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
               _M_head_impl + 0x10);
  (this->gmock3_AddIntSuffix_249).
  super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.current_spec_
  .matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<int>,_testing::Matcher<int>_>
  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  (this->gmock3_AddIntSuffix_249).
  super_FunctionMockerBase<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028bd88;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_AddDblSuffix_255);
  (this->gmock3_AddDblSuffix_255).
  super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_AddDblSuffix_255).
        super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<2UL,_testing::Matcher<int>_> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<2UL,_testing::Matcher<int>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddDblSuffix_255).
               super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
               .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
               super__Tuple_impl<2UL,_testing::Matcher<int>_> + 0x10);
  (this->gmock3_AddDblSuffix_255).
  super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
  super__Tuple_impl<2UL,_testing::Matcher<int>_>.super__Head_base<2UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<mp::suf::Kind>_> *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false> + 8))->value_ =
       (MatcherInterface<mp::suf::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddDblSuffix_255).
               super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
               .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false> + 0x10);
  (this->gmock3_AddDblSuffix_255).
  super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
  .super__Tuple_impl<1UL,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>.
  super__Head_base<1UL,_testing::Matcher<mp::suf::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::suf::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028bf98;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  8))->value_ = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_AddDblSuffix_255).
          super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
          .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_AddDblSuffix_255).
               super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
               .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
               _M_head_impl + 0x10);
  (this->gmock3_AddDblSuffix_255).
  super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::suf::Kind>,_testing::Matcher<int>_>
  .super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  (this->gmock3_AddDblSuffix_255).
  super_FunctionMockerBase<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028bec8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeNumericConstant_260);
  (this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>;
  ((linked_ptr<const_testing::MatcherInterface<double>_> *)
  ((long)&(this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>
          .current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>_>.
          super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<double> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>
          .current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>_>.
          super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_MakeNumericConstant_260).
               super_FunctionMockerBase<BasicTestExpr<1>_(double)>.current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<double>_>.
               super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl + 0x10);
  (this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028aa40;
  (this->gmock1_MakeNumericConstant_260).super_FunctionMockerBase<BasicTestExpr<1>_(double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c070;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeVariable_261);
  (this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.current_spec_.
  function_mocker_ = &(this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_MakeVariable_261).super_FunctionMockerBase<TestReference_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c1b0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeCommonExpr_262);
  (this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_MakeCommonExpr_262).super_FunctionMockerBase<TestReference_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c1b0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_MakeUnary_263);
  (this->gmock2_MakeUnary_263).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.current_spec_.
  function_mocker_ =
       &(this->gmock2_MakeUnary_263).
        super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock2_MakeUnary_263).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_MakeUnary_263).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_MakeUnary_263).
               super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock2_MakeUnary_263).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock2_MakeUnary_263).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_MakeUnary_263).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock2_MakeUnary_263).
                  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
                  current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>
                  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl +
          0x10);
  (this->gmock2_MakeUnary_263).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock2_MakeUnary_263).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c2c0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeBinary_266);
  (this->gmock3_MakeBinary_266).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeBinary_266).
        super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeBinary_266).
               super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10);
  (this->gmock3_MakeBinary_266).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeBinary_266).
               super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock3_MakeBinary_266).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinary_266).
          super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeBinary_266).
                  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeBinary_266).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock3_MakeBinary_266).
  super_FunctionMockerBase<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c428;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeIf_270);
  (this->gmock3_MakeIf_270).
  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeIf_270).
        super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeIf_270).
               super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10);
  (this->gmock3_MakeIf_270).
  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeIf_270).
               super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock3_MakeIf_270).
  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeIf_270).
          super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeIf_270).
                  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeIf_270).
  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  (this->gmock3_MakeIf_270).
  super_FunctionMockerBase<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c528;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_BeginPLTerm_274);
  (this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.
               current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_BeginPLTerm_274).super_FunctionMockerBase<TestPLTermBuilder_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c628;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_EndPLTerm_275);
  (this->gmock2_EndPLTerm_275).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.current_spec_.
  function_mocker_ =
       &(this->gmock2_EndPLTerm_275).
        super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock2_EndPLTerm_275).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_EndPLTerm_275).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_EndPLTerm_275).
               super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock2_EndPLTerm_275).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<TestPLTermBuilder>_> *)
  ((long)&(this->gmock2_EndPLTerm_275).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<TestPLTermBuilder> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_EndPLTerm_275).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock2_EndPLTerm_275).
                  super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
                  current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
                  .super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl +
          0x10);
  (this->gmock2_EndPLTerm_275).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestPLTermBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestPLTermBuilder>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c808;
  (this->gmock2_EndPLTerm_275).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c738;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginCall_279);
  (this->gmock2_BeginCall_279).super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginCall_279).
        super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginCall_279).
          super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginCall_279).
          super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginCall_279).
               super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.
               matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
               super__Tuple_impl<1UL,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock2_BeginCall_279).super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<TestFunction>_> *)
  ((long)&(this->gmock2_BeginCall_279).
          super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<TestFunction>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<TestFunction> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginCall_279).
          super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<TestFunction>,_false>._M_head_impl + 0x10))->next_
       = (linked_ptr_internal *)
         ((long)&(this->gmock2_BeginCall_279).
                 super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.current_spec_.
                 matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
                 super__Head_base<0UL,_testing::Matcher<TestFunction>,_false>._M_head_impl + 0x10);
  (this->gmock2_BeginCall_279).super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<TestFunction>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<TestFunction>,_false>._M_head_impl.
  super_MatcherBase<TestFunction>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c970;
  (this->gmock2_BeginCall_279).super_FunctionMockerBase<TestCallExprBuilder_(TestFunction,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028c8a0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndCall_280);
  (this->gmock1_EndCall_280).super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_EndCall_280).super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>;
  ((linked_ptr<const_testing::MatcherInterface<TestCallExprBuilder>_> *)
  ((long)&(this->gmock1_EndCall_280).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
          super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<TestCallExprBuilder> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndCall_280).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
          super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl + 0x10))
  ->next_ = (linked_ptr_internal *)
            ((long)&(this->gmock1_EndCall_280).
                    super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.current_spec_.
                    matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
                    super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl
            + 0x10);
  (this->gmock1_EndCall_280).super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestCallExprBuilder>_>.
  super__Head_base<0UL,_testing::Matcher<TestCallExprBuilder>,_false>._M_head_impl.
  super_MatcherBase<TestCallExprBuilder>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028cb18;
  (this->gmock1_EndCall_280).super_FunctionMockerBase<BasicTestExpr<1>_(TestCallExprBuilder)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ca48;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginIterated_285);
  (this->gmock2_BeginIterated_285).
  super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginIterated_285).
        super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginIterated_285).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginIterated_285).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginIterated_285).
               super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
               super__Tuple_impl<1UL,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock2_BeginIterated_285).
  super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock2_BeginIterated_285).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginIterated_285).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock2_BeginIterated_285).
                  super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
                  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10
          );
  (this->gmock2_BeginIterated_285).
  super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock2_BeginIterated_285).
  super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028cbb0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndIterated_286);
  (this->gmock1_EndIterated_286).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndIterated_286).
        super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_> *)
  ((long)&(this->gmock1_EndIterated_286).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndIterated_286).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndIterated_286).
               super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndIterated_286).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028cdc0;
  (this->gmock1_EndIterated_286).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ccf0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_BeginSum_288);
  (this->gmock1_BeginSum_288).super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_BeginSum_288).
        super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_BeginSum_288).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_BeginSum_288).
          super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_BeginSum_288).
               super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_BeginSum_288).super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_BeginSum_288).super_FunctionMockerBase<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ce58;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndSum_289);
  (this->gmock1_EndSum_289).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndSum_289).
        super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_>_> *)
  ((long)&(this->gmock1_EndSum_289).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndSum_289).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndSum_289).
               super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndSum_289).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<1,_BasicTestExpr<1>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028cdc0;
  (this->gmock1_EndSum_289).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028ccf0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_BeginCount_293);
  (this->gmock1_BeginCount_293).
  super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_BeginCount_293).
        super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock1_BeginCount_293).
          super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_BeginCount_293).
          super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_BeginCount_293).
               super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock1_BeginCount_293).
  super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>_>.super__Head_base<0UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock1_BeginCount_293).
  super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028cf28;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndCount_294);
  (this->gmock1_EndCount_294).
  super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndCount_294).
        super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_>_> *)
  ((long)&(this->gmock1_EndCount_294).
          super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndCount_294).
          super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndCount_294).
               super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndCount_294).
  super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<3,_BasicTestExpr<2>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028d108;
  (this->gmock1_EndCount_294).
  super_FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d038;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginNumberOf_299);
  (this->gmock2_BeginNumberOf_299).
  super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginNumberOf_299).
        super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock2_BeginNumberOf_299).
          super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginNumberOf_299).
          super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginNumberOf_299).
               super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock2_BeginNumberOf_299).
  super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginNumberOf_299).
          super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginNumberOf_299).
          super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginNumberOf_299).
               super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock2_BeginNumberOf_299).
  super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock2_BeginNumberOf_299).
  super_FunctionMockerBase<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d1e0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndNumberOf_300);
  (this->gmock1_EndNumberOf_300).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndNumberOf_300).
        super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_>_> *)
  ((long)&(this->gmock1_EndNumberOf_300).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndNumberOf_300).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndNumberOf_300).
               super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndNumberOf_300).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<2,_BasicTestExpr<1>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028d3f0;
  (this->gmock1_EndNumberOf_300).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d320;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginSymbolicNumberOf_305);
  (this->gmock2_BeginSymbolicNumberOf_305).
  super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginSymbolicNumberOf_305).
        super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *)
  ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
          super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
          super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
               super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>_>.
               super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 0x10);
  (this->gmock2_BeginSymbolicNumberOf_305).
  super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
  super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028d558;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
          super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
          super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
          super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginSymbolicNumberOf_305).
               super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
               super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl + 0x10);
  (this->gmock2_BeginSymbolicNumberOf_305).
  super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<0>_>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  (this->gmock2_BeginSymbolicNumberOf_305).
  super_FunctionMockerBase<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d488;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndSymbolicNumberOf_307);
  (this->gmock1_EndSymbolicNumberOf_307).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndSymbolicNumberOf_307).
        super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *)
  ((long)&(this->gmock1_EndSymbolicNumberOf_307).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndSymbolicNumberOf_307).
          super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndSymbolicNumberOf_307).
               super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndSymbolicNumberOf_307).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028d700;
  (this->gmock1_EndSymbolicNumberOf_307).
  super_FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d630;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeLogicalConstant_309);
  (this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>;
  ((linked_ptr<const_testing::MatcherInterface<bool>_> *)
  ((long)&(this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<bool>_>.
          super__Head_base<0UL,_testing::Matcher<bool>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<bool> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<bool>_>.
          super__Head_base<0UL,_testing::Matcher<bool>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_MakeLogicalConstant_309).
               super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<bool>_>.
               super__Head_base<0UL,_testing::Matcher<bool>,_false>._M_head_impl + 0x10);
  (this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<bool>_>.
  super__Head_base<0UL,_testing::Matcher<bool>,_false>._M_head_impl.super_MatcherBase<bool>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028d868;
  (this->gmock1_MakeLogicalConstant_309).super_FunctionMockerBase<BasicTestExpr<2>_(bool)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d798;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeNot_310);
  (this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.
  current_spec_.function_mocker_ =
       &(this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.
          current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
          super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock1_MakeNot_310).
                  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.current_spec_.
                  matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
                  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl +
          0x10);
  (this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.
  current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>_>.
  super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  (this->gmock1_MakeNot_310).super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028d940;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeBinaryLogical_313);
  (this->gmock3_MakeBinaryLogical_313).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeBinaryLogical_313).
        super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeBinaryLogical_313).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 0x10);
  (this->gmock3_MakeBinaryLogical_313).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeBinaryLogical_313).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 0x10);
  (this->gmock3_MakeBinaryLogical_313).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeBinaryLogical_313).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeBinaryLogical_313).
                  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeBinaryLogical_313).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock3_MakeBinaryLogical_313).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028da10;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeRelational_316);
  (this->gmock3_MakeRelational_316).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeRelational_316).
        super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeRelational_316).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_> + 0x10);
  (this->gmock3_MakeRelational_316).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeRelational_316).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock3_MakeRelational_316).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeRelational_316).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeRelational_316).
                  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeRelational_316).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock3_MakeRelational_316).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028db10;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeLogicalCount_319);
  (this->gmock3_MakeLogicalCount_319).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeLogicalCount_319).
        super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<TestCountExpr>_> *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_> + 8))->value_ =
       (MatcherInterface<TestCountExpr> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeLogicalCount_319).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
               .super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_> + 0x10);
  (this->gmock3_MakeLogicalCount_319).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>.
  super__Tuple_impl<2UL,_testing::Matcher<TestCountExpr>_>.
  super__Head_base<2UL,_testing::Matcher<TestCountExpr>,_false>._M_head_impl.
  super_MatcherBase<TestCountExpr>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028dcb0;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<1>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeLogicalCount_319).
               super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false> + 0x10);
  (this->gmock3_MakeLogicalCount_319).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>.
  super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<1>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028b258;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeLogicalCount_319).
          super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
          .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeLogicalCount_319).
                  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
                  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeLogicalCount_319).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<TestCountExpr>_>
  .super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock3_MakeLogicalCount_319).
  super_FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028dbe0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeImplication_322);
  (this->gmock3_MakeImplication_322).
  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeImplication_322).
        super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeImplication_322).
               super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_> + 0x10);
  (this->gmock3_MakeImplication_322).
  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<2>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeImplication_322).
               super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false> + 0x10);
  (this->gmock3_MakeImplication_322).
  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeImplication_322).
          super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeImplication_322).
                  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeImplication_322).
  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  (this->gmock3_MakeImplication_322).
  super_FunctionMockerBase<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028dd48;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginIteratedLogical_327);
  (this->gmock2_BeginIteratedLogical_327).
  super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginIteratedLogical_327).
        super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginIteratedLogical_327).
          super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginIteratedLogical_327).
          super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginIteratedLogical_327).
               super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
               super__Tuple_impl<1UL,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock2_BeginIteratedLogical_327).
  super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock2_BeginIteratedLogical_327).
          super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginIteratedLogical_327).
          super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock2_BeginIteratedLogical_327).
                  super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
                  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10
          );
  (this->gmock2_BeginIteratedLogical_327).
  super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock2_BeginIteratedLogical_327).
  super_FunctionMockerBase<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028de48;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndIteratedLogical_329);
  (this->gmock1_EndIteratedLogical_329).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndIteratedLogical_329).
        super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_>_> *)
  ((long)&(this->gmock1_EndIteratedLogical_329).
          super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndIteratedLogical_329).
          super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndIteratedLogical_329).
               super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndIteratedLogical_329).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<4,_BasicTestExpr<2>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028e028;
  (this->gmock1_EndIteratedLogical_329).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028df58;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_BeginPairwise_334);
  (this->gmock2_BeginPairwise_334).
  super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.function_mocker_ =
       &(this->gmock2_BeginPairwise_334).
        super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>;
  ((linked_ptr<const_testing::MatcherInterface<int>_> *)
  ((long)&(this->gmock2_BeginPairwise_334).
          super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 8))->value_ =
       (MatcherInterface<int> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginPairwise_334).
          super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Tuple_impl<1UL,_testing::Matcher<int>_>.
          super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_BeginPairwise_334).
               super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
               super__Tuple_impl<1UL,_testing::Matcher<int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false> + 0x10);
  (this->gmock2_BeginPairwise_334).
  super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a4f8;
  ((linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> *)
  ((long)&(this->gmock2_BeginPairwise_334).
          super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 8))->value_
       = (MatcherInterface<mp::expr::Kind> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_BeginPairwise_334).
          super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
          super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock2_BeginPairwise_334).
                  super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
                  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl + 0x10
          );
  (this->gmock2_BeginPairwise_334).
  super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<mp::expr::Kind>,_false>._M_head_impl.
  super_MatcherBase<mp::expr::Kind>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028c390;
  (this->gmock2_BeginPairwise_334).
  super_FunctionMockerBase<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028e0c0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_EndPairwise_335);
  (this->gmock1_EndPairwise_335).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_EndPairwise_335).
        super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>;
  ((linked_ptr<const_testing::MatcherInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_>_> *)
  ((long)&(this->gmock1_EndPairwise_335).
          super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 8))->value_ =
       (MatcherInterface<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_EndPairwise_335).
          super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
          super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
          _M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_EndPairwise_335).
               super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
               super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>
               ._M_head_impl + 0x10);
  (this->gmock1_EndPairwise_335).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>_>.
  super__Head_base<0UL,_testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>,_false>.
  _M_head_impl.super_MatcherBase<TestExprBuilder<5,_BasicTestExpr<1>_>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028e2a0;
  (this->gmock1_EndPairwise_335).
  super_FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028e1d0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock1_MakeStringLiteral_337);
  (this->gmock1_MakeStringLiteral_337).
  super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.current_spec_.
  function_mocker_ =
       &(this->gmock1_MakeStringLiteral_337).
        super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>;
  ((linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *)
  ((long)&(this->gmock1_MakeStringLiteral_337).
          super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
          super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  8))->value_ = (MatcherInterface<fmt::BasicStringRef<char>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_MakeStringLiteral_337).
          super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
          super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl +
  0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock1_MakeStringLiteral_337).
               super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
               super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
               _M_head_impl + 0x10);
  (this->gmock1_MakeStringLiteral_337).
  super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>_>.
  super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bae0;
  (this->gmock1_MakeStringLiteral_337).
  super_FunctionMockerBase<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028e338;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock3_MakeSymbolicIf_340);
  (this->gmock3_MakeSymbolicIf_340).
  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>.
  current_spec_.function_mocker_ =
       &(this->gmock3_MakeSymbolicIf_340).
        super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<0>_>_> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<0>_>_> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeSymbolicIf_340).
               super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
               .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<0>_>_> + 0x10);
  (this->gmock3_MakeSymbolicIf_340).
  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
  .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<0>_>_>.
  super__Head_base<2UL,_testing::Matcher<BasicTestExpr<0>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028d558;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 8))->value_ =
       (MatcherInterface<BasicTestExpr<0>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .
          super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock3_MakeSymbolicIf_340).
               super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
               .
               super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
               .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false> + 0x10);
  (this->gmock3_MakeSymbolicIf_340).
  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
  .super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
  .super__Head_base<1UL,_testing::Matcher<BasicTestExpr<0>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<0>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028d558;
  ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<2>_>_> *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 8))->
  value_ = (MatcherInterface<BasicTestExpr<2>_> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock3_MakeSymbolicIf_340).
          super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
          .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl + 0x10))->
  next_ = (linked_ptr_internal *)
          ((long)&(this->gmock3_MakeSymbolicIf_340).
                  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
                  .current_spec_.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
                  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl +
          0x10);
  (this->gmock3_MakeSymbolicIf_340).
  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>.
  current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<0>_>,_testing::Matcher<BasicTestExpr<0>_>_>
  .super__Head_base<0UL,_testing::Matcher<BasicTestExpr<2>_>,_false>._M_head_impl.
  super_MatcherBase<BasicTestExpr<2>_>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028afe0;
  (this->gmock3_MakeSymbolicIf_340).
  super_FunctionMockerBase<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028e478;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock0_problem_342);
  (this->gmock0_problem_342).super_FunctionMockerBase<MockProblemBuilder_&()>.current_spec_.
  function_mocker_ = &(this->gmock0_problem_342).super_FunctionMockerBase<MockProblemBuilder_&()>;
  (this->gmock0_problem_342).super_FunctionMockerBase<MockProblemBuilder_&()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_0028e578;
  return;
}

Assistant:

MockProblemBuilder() {}